

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

void __thiscall cppwinrt::writer::add_depends(writer *this,TypeDef *type)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  bool bVar1;
  mapped_type *this_00;
  string_view __x;
  undefined1 local_28 [8];
  string_view ns;
  TypeDef *type_local;
  writer *this_local;
  
  ns._M_str = (char *)type;
  __x = winmd::reader::TypeDef::TypeNamespace(type);
  _local_28 = __x;
  __y = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->type_namespace);
  bVar1 = ::std::operator!=(__x,__y);
  if (bVar1) {
    this_00 = std::
              map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
              ::operator[](&this->depends,(key_type *)local_28);
    std::
    set<winmd::reader::TypeDef,_cppwinrt::writer::depends_compare,_std::allocator<winmd::reader::TypeDef>_>
    ::insert(this_00,(value_type *)ns._M_str);
  }
  return;
}

Assistant:

void add_depends(TypeDef const& type)
        {
            auto ns = type.TypeNamespace();

            if (ns != type_namespace)
            {
                depends[ns].insert(type);
            }
        }